

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csg.h
# Opt level: O3

object * ocmesh::details::scale(object *node,float factor)

{
  length_t i;
  long lVar1;
  transform_t *ptVar2;
  byte bVar3;
  tvec3<bool,_(glm::precision)0> Result;
  tmat4x4<float,_(glm::precision)0> Result_1;
  byte local_57 [3];
  float local_54 [3];
  object *local_48;
  tmat4x4<float,_(glm::precision)0> local_40;
  
  if ((factor == 0.0) && (!NAN(factor))) {
    __assert_fail("factor != 0 && \"Scaling factor must be non-zero\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nicola-gigante[P]ocmesh/include/csg.h"
                  ,0x183,"object *ocmesh::details::scale(object *, float)");
  }
  local_54[0] = factor;
  local_54[1] = factor;
  local_54[2] = factor;
  local_40.value[0].field_0 = (anon_union_4_3_4e90da17_for_tvec4<float,_(glm::precision)0>_2)0x0;
  local_40.value[0].field_1 = (anon_union_4_3_4e90b0ec_for_tvec4<float,_(glm::precision)0>_4)0x0;
  local_40.value[0].field_2.z = 0.0;
  lVar1 = 0;
  do {
    local_57[lVar1] = local_54[lVar1] != (&local_40.value[0].field_0)[lVar1].x;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  bVar3 = 1;
  lVar1 = 0;
  do {
    while ((bVar3 & 1) == 0) {
      lVar1 = lVar1 + 1;
      bVar3 = 0;
      if (lVar1 == 3) {
LAB_0010bce3:
        __assert_fail("glm::all(glm::notEqual(factors, {})) && \"Scaling factor components must be non-zero\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nicola-gigante[P]ocmesh/include/csg.h"
                      ,0x17e,"object *ocmesh::details::scale(object *, const glm::vec3 &)");
      }
    }
    bVar3 = local_57[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (bVar3 != 0) {
    local_40.value[0].field_2.z = factor * 0.0;
    local_40.value[0].field_1.y = local_40.value[0].field_2.z;
    local_40.value[0].field_0.x = factor;
    local_40.value[3].field_0 = (anon_union_4_3_4e90da17_for_tvec4<float,_(glm::precision)0>_2)0x0;
    local_40.value[3].field_1 = (anon_union_4_3_4e90b0ec_for_tvec4<float,_(glm::precision)0>_4)0x0;
    local_40.value[3].field_2 = (anon_union_4_3_4e909dac_for_tvec4<float,_(glm::precision)0>_6)0x0;
    local_40.value[3].field_3 =
         (anon_union_4_3_4e909a07_for_tvec4<float,_(glm::precision)0>_8)0x3f800000;
    local_48 = node;
    local_40.value[0].field_3.w = local_40.value[0].field_2.z;
    local_40.value[1].field_0.x = local_40.value[0].field_2.z;
    local_40.value[1].field_1.y = factor;
    local_40.value[1].field_2 = local_40.value[0].field_2;
    local_40.value[1].field_3.w = local_40.value[0].field_2.z;
    local_40.value[2].field_0.x = local_40.value[0].field_2.z;
    local_40.value[2].field_1.y = local_40.value[0].field_2.z;
    local_40.value[2].field_2.z = factor;
    local_40.value[2].field_3.w = local_40.value[0].field_2.z;
    ptVar2 = scene::
             make<ocmesh::details::transform_t,_ocmesh::details::object_*&,_const_glm::tmat4x4<float,_(glm::precision)0>_&,_void,_0>
                       (node->_scene,&local_48,&local_40);
    return &ptVar2->super_object;
  }
  goto LAB_0010bce3;
}

Assistant:

inline object *scale(object *node, float factor) {
        assert(factor != 0 && "Scaling factor must be non-zero");
        return scale(node, { factor, factor, factor });
    }